

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2mtb.cpp
# Opt level: O2

void printEvent(vector<double,_std::allocator<double>_> *event)

{
  pointer pdVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0;
      pdVar1 = (event->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(event->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
      lVar2 = lVar2 + 1) {
    std::ostream::_M_insert<double>(pdVar1[lVar2]);
    if (lVar2 < ((long)(event->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(event->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start) * 0x20000000 + -0x100000000 >> 0x20) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void printEvent(vector<double>& event) {
	for (int i=0; i<(int)event.size(); i++) {
		cout << event[i];
		if (i<(int)event.size()-1) {
			cout << "\t";
		}
	}
	cout << "\n";
}